

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_basis_file.cpp
# Opt level: O0

void __thiscall
basisu::basisu_file::create_comp_data(basisu_file *this,basisu_backend_output *encoder_output)

{
  uint32_t uVar1;
  vector<basisu::vector<unsigned_char>_> *this_00;
  vector<unsigned_char> *this_01;
  long in_RSI;
  long in_RDI;
  uint32_t i;
  basisu_backend_slice_desc_vec *slice_descs;
  size_t in_stack_ffffffffffffff78;
  vector<basist::basis_slice_desc> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar2;
  uchar *in_stack_ffffffffffffff98;
  vector<unsigned_char> *in_stack_ffffffffffffffa0;
  uint local_1c;
  
  append_vector<basisu::vector<unsigned_char>,unsigned_char>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  uVar1 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x60));
  if (uVar1 != *(uint32_t *)(in_RDI + 0x74)) {
    __assert_fail("m_comp_data.size() == m_slice_descs_file_ofs",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                  ,0x98,"void basisu::basisu_file::create_comp_data(const basisu_backend_output &)")
    ;
  }
  vector<basist::basis_slice_desc>::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  vector<basist::basis_slice_desc>::size((vector<basist::basis_slice_desc> *)(in_RDI + 0x50));
  append_vector<basisu::vector<unsigned_char>,unsigned_char>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if ((*(byte *)(in_RSI + 5) & 1) == 0) {
    uVar1 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RSI + 0x10));
    if (uVar1 != 0) {
      uVar1 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x60));
      if (uVar1 != *(uint32_t *)(in_RDI + 0x78)) {
        __assert_fail("m_comp_data.size() == m_endpoint_cb_file_ofs",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                      ,0x9f,
                      "void basisu::basisu_file::create_comp_data(const basisu_backend_output &)");
      }
      vector<unsigned_char>::operator[]
                ((vector<unsigned_char> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      vector<unsigned_char>::size((vector<unsigned_char> *)(in_RSI + 0x10));
      append_vector<basisu::vector<unsigned_char>,unsigned_char>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
    uVar1 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RSI + 0x20));
    if (uVar1 != 0) {
      uVar1 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x60));
      if (uVar1 != *(uint32_t *)(in_RDI + 0x7c)) {
        __assert_fail("m_comp_data.size() == m_selector_cb_file_ofs",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                      ,0xa5,
                      "void basisu::basisu_file::create_comp_data(const basisu_backend_output &)");
      }
      vector<unsigned_char>::operator[]
                ((vector<unsigned_char> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      vector<unsigned_char>::size((vector<unsigned_char> *)(in_RSI + 0x20));
      append_vector<basisu::vector<unsigned_char>,unsigned_char>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
  }
  uVar1 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RSI + 0x40));
  if (uVar1 != 0) {
    uVar1 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x60));
    if (uVar1 != *(uint32_t *)(in_RDI + 0x80)) {
      __assert_fail("m_comp_data.size() == m_tables_file_ofs",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                    ,0xac,
                    "void basisu::basisu_file::create_comp_data(const basisu_backend_output &)");
    }
    in_stack_ffffffffffffff98 = (uchar *)(in_RDI + 0x60);
    in_stack_ffffffffffffffa0 =
         (vector<unsigned_char> *)
         vector<unsigned_char>::operator[]
                   ((vector<unsigned_char> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    vector<unsigned_char>::size((vector<unsigned_char> *)(in_RSI + 0x40));
    append_vector<basisu::vector<unsigned_char>,unsigned_char>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  uVar1 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x60));
  if (uVar1 != *(uint32_t *)(in_RDI + 0x84)) {
    __assert_fail("m_comp_data.size() == m_first_image_file_ofs",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                  ,0xb0,"void basisu::basisu_file::create_comp_data(const basisu_backend_output &)")
    ;
  }
  local_1c = 0;
  while (uVar2 = local_1c,
        uVar1 = vector<basisu::basisu_backend_slice_desc>::size
                          ((vector<basisu::basisu_backend_slice_desc> *)(in_RSI + 0x30)),
        uVar2 < uVar1) {
    this_00 = (vector<basisu::vector<unsigned_char>_> *)(in_RDI + 0x60);
    vector<basisu::vector<unsigned_char>_>::operator[](this_00,in_stack_ffffffffffffff78);
    vector<unsigned_char>::operator[]((vector<unsigned_char> *)this_00,in_stack_ffffffffffffff78);
    this_01 = vector<basisu::vector<unsigned_char>_>::operator[](this_00,in_stack_ffffffffffffff78);
    vector<unsigned_char>::size(this_01);
    append_vector<basisu::vector<unsigned_char>,unsigned_char>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               CONCAT44(uVar2,in_stack_ffffffffffffff90));
    local_1c = local_1c + 1;
  }
  uVar1 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x60));
  if (uVar1 != *(uint32_t *)(in_RDI + 0x88)) {
    __assert_fail("m_comp_data.size() == m_total_file_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                  ,0xb4,"void basisu::basisu_file::create_comp_data(const basisu_backend_output &)")
    ;
  }
  return;
}

Assistant:

void basisu_file::create_comp_data(const basisu_backend_output &encoder_output)
	{
		const basisu_backend_slice_desc_vec &slice_descs = encoder_output.m_slice_desc;

		append_vector(m_comp_data, reinterpret_cast<const uint8_t *>(&m_header), sizeof(m_header));

		assert(m_comp_data.size() == m_slice_descs_file_ofs);
		append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&m_images_descs[0]), m_images_descs.size() * sizeof(m_images_descs[0]));

		if (!encoder_output.m_uses_global_codebooks)
		{
			if (encoder_output.m_endpoint_palette.size())
			{
				assert(m_comp_data.size() == m_endpoint_cb_file_ofs);
				append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&encoder_output.m_endpoint_palette[0]), encoder_output.m_endpoint_palette.size());
			}

			if (encoder_output.m_selector_palette.size())
			{
				assert(m_comp_data.size() == m_selector_cb_file_ofs);
				append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&encoder_output.m_selector_palette[0]), encoder_output.m_selector_palette.size());
			}
		}

		if (encoder_output.m_slice_image_tables.size())
		{
			assert(m_comp_data.size() == m_tables_file_ofs);
			append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&encoder_output.m_slice_image_tables[0]), encoder_output.m_slice_image_tables.size());
		}

		assert(m_comp_data.size() == m_first_image_file_ofs);
		for (uint32_t i = 0; i < slice_descs.size(); i++)
			append_vector(m_comp_data, &encoder_output.m_slice_image_data[i][0], encoder_output.m_slice_image_data[i].size());

		assert(m_comp_data.size() == m_total_file_size);
	}